

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O3

FilterPropagateResult __thiscall
duckdb::InFilter::CheckStatistics(InFilter *this,BaseStatistics *stats)

{
  PhysicalType PVar1;
  Value *pVVar2;
  FilterPropagateResult FVar3;
  reference pvVar4;
  idx_t in_R8;
  array_ptr<duckdb::Value,_true> constants;
  array_ptr<duckdb::Value,_true> constants_00;
  array_ptr<duckdb::Value,_true> local_38;
  array_ptr<duckdb::Value,_true> local_28;
  
  FVar3 = NO_PRUNING_POSSIBLE;
  pvVar4 = vector<duckdb::Value,_true>::operator[](&this->values,0);
  PVar1 = (pvVar4->type_).physical_type_;
  if (((PVar1 < 0xd) && ((0x1bfcU >> (PVar1 & 0x1f) & 1) != 0)) || (PVar1 - 0xcb < 2)) {
    pVVar2 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    array_ptr<duckdb::Value,_true>::array_ptr
              (&local_28,pVVar2,
               (long)(this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pVVar2 >> 6);
    constants.count = in_R8;
    constants.ptr = (Value *)local_28.count;
    FVar3 = NumericStats::CheckZonemap
                      ((NumericStats *)stats,(BaseStatistics *)0x19,(ExpressionType)local_28.ptr,
                       constants);
  }
  else if (PVar1 == VARCHAR) {
    pVVar2 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    array_ptr<duckdb::Value,_true>::array_ptr
              (&local_38,pVVar2,
               (long)(this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pVVar2 >> 6);
    constants_00.count = in_R8;
    constants_00.ptr = (Value *)local_38.count;
    FVar3 = StringStats::CheckZonemap
                      ((StringStats *)stats,(BaseStatistics *)0x19,(ExpressionType)local_38.ptr,
                       constants_00);
  }
  return FVar3;
}

Assistant:

FilterPropagateResult InFilter::CheckStatistics(BaseStatistics &stats) {
	switch (values[0].type().InternalType()) {
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::UINT128:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		return NumericStats::CheckZonemap(stats, ExpressionType::COMPARE_EQUAL,
		                                  array_ptr<Value>(values.data(), values.size()));
	case PhysicalType::VARCHAR:
		return StringStats::CheckZonemap(stats, ExpressionType::COMPARE_EQUAL,
		                                 array_ptr<Value>(values.data(), values.size()));
	default:
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	}
}